

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>::set_paging<3>
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true> *this)

{
  pointer puVar1;
  uint8_t *read;
  uint8_t *read_00;
  long lVar2;
  uint8_t *read_01;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *write;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *write_00;
  uint8_t *write_01;
  bool bVar7;
  
  lVar2 = (ulong)(this->auxiliary_switches_).switches_.alternative_zero_page * 0x10000;
  this->write_pages_[0] = this->ram_ + lVar2;
  this->write_pages_[1] = this->ram_ + lVar2 + 0x100;
  this->read_pages_[0] = this->ram_ + lVar2;
  this->read_pages_[1] = this->ram_ + lVar2 + 0x100;
  puVar1 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar7 = ((this->language_card_).state_.write & 1U) != 0;
  puVar4 = this->ram_ + (ulong)(((this->language_card_).state_.bank2 & 1) << 0xc) + lVar2 + 0xc000;
  if (bVar7) {
    puVar4 = (uint8_t *)0x0;
  }
  puVar5 = (uint8_t *)0x0;
  if (!bVar7) {
    puVar5 = this->ram_ + lVar2 + 0xe000;
  }
  puVar6 = puVar1 + 0x1f00;
  puVar3 = puVar1 + 0xf00;
  if (((this->language_card_).state_.read & 1U) != 0) {
    puVar6 = this->ram_ + lVar2 + 0xe000;
    puVar3 = this->ram_ + (ulong)(((this->language_card_).state_.bank2 & 1) << 0xc) + lVar2 + 0xc000
    ;
  }
  page(this,0xd0,0xe0,puVar3,puVar4);
  page(this,0xe0,0x100,puVar6,puVar5);
  puVar4 = this->ram_ + 0x2000;
  if (((this->auxiliary_switches_).main_state_.region_20_40.write & 1U) != 0) {
    puVar4 = this->aux_ram_ + 0x2000;
  }
  puVar5 = this->ram_ + 0x2000;
  if (((this->auxiliary_switches_).main_state_.region_20_40.read & 1U) != 0) {
    puVar5 = this->aux_ram_ + 0x2000;
  }
  puVar3 = this->ram_ + 0x400;
  if (((this->auxiliary_switches_).main_state_.region_04_08.write & 1U) != 0) {
    puVar3 = this->aux_ram_ + 0x400;
  }
  puVar6 = this->ram_ + 0x400;
  if (((this->auxiliary_switches_).main_state_.region_04_08.read & 1U) != 0) {
    puVar6 = this->aux_ram_ + 0x400;
  }
  bVar7 = ((this->auxiliary_switches_).main_state_.base.write & 1U) != 0;
  write = this->ram_ + 0x200;
  if (bVar7) {
    write = this->aux_ram_ + 0x200;
  }
  write_01 = this->ram_ + 0x800;
  if (bVar7) {
    write_01 = this->aux_ram_ + 0x800;
  }
  write_00 = this->ram_ + 0x4000;
  if (bVar7) {
    write_00 = this->aux_ram_ + 0x4000;
  }
  read_01 = this->ram_ + 0x4000;
  read = this->ram_ + 0x200;
  read_00 = this->ram_ + 0x800;
  if (((this->auxiliary_switches_).main_state_.base.read & 1U) != 0) {
    read_01 = this->aux_ram_ + 0x4000;
    read = this->aux_ram_ + 0x200;
    read_00 = this->aux_ram_ + 0x800;
  }
  page(this,2,4,read,write);
  page(this,8,0x20,read_00,write_01);
  page(this,0x40,0xc0,read_01,write_00);
  page(this,4,8,puVar6,puVar3);
  page(this,0x20,0x40,puVar5,puVar4);
  return;
}

Assistant:

void set_paging() {
			if constexpr (bool(type & PagingType::ZeroPage)) {
				if(auxiliary_switches_.zero_state()) {
					write_pages_[0] = aux_ram_;
				} else {
					write_pages_[0] = ram_;
				}
				write_pages_[1] = write_pages_[0] + 256;
				read_pages_[0] = write_pages_[0];
				read_pages_[1] = write_pages_[1];
			}

			if constexpr (bool(type & (PagingType::LanguageCard | PagingType::ZeroPage))) {
				const auto language_state = language_card_.state();
				const auto zero_state = auxiliary_switches_.zero_state();

				uint8_t *const ram = zero_state ? aux_ram_ : ram_;
				uint8_t *const rom = is_iie(model) ? &rom_[3840] : rom_.data();

				// Which way the region here is mapped to be banks 1 and 2 is
				// arbitrary.
				page(0xd0, 0xe0,
					language_state.read ? &ram[language_state.bank2 ? 0xd000 : 0xc000] : rom,
					language_state.write ? nullptr : &ram[language_state.bank2 ? 0xd000 : 0xc000]);

				page(0xe0, 0x100,
					language_state.read ? &ram[0xe000] : &rom[0x1000],
					language_state.write ? nullptr : &ram[0xe000]);
			}

			if constexpr (bool(type & PagingType::CardArea)) {
				const auto state = auxiliary_switches_.card_state();

				page(0xc1, 0xc4, state.region_C1_C3 ? &rom_[0xc100 - 0xc100] : nullptr, nullptr);
				read_pages_[0xc3] = state.region_C3 ? &rom_[0xc300 - 0xc100] : nullptr;
				page(0xc4, 0xc8, state.region_C4_C8 ? &rom_[0xc400 - 0xc100] : nullptr, nullptr);
				page(0xc8, 0xd0, state.region_C8_D0 ? &rom_[0xc800 - 0xc100] : nullptr, nullptr);
			}

			if constexpr (bool(type & PagingType::Main)) {
				const auto state = auxiliary_switches_.main_state();

				page(0x02, 0x04,
					state.base.read ? &aux_ram_[0x0200] : &ram_[0x0200],
					state.base.write ? &aux_ram_[0x0200] : &ram_[0x0200]);
				page(0x08, 0x20,
					state.base.read ? &aux_ram_[0x0800] : &ram_[0x0800],
					state.base.write ? &aux_ram_[0x0800] : &ram_[0x0800]);
				page(0x40, 0xc0,
					state.base.read ? &aux_ram_[0x4000] : &ram_[0x4000],
					state.base.write ? &aux_ram_[0x4000] : &ram_[0x4000]);

				page(0x04, 0x08,
					state.region_04_08.read ? &aux_ram_[0x0400] : &ram_[0x0400],
					state.region_04_08.write ? &aux_ram_[0x0400] : &ram_[0x0400]);

				page(0x20, 0x40,
					state.region_20_40.read ? &aux_ram_[0x2000] : &ram_[0x2000],
					state.region_20_40.write ? &aux_ram_[0x2000] : &ram_[0x2000]);
			}
		}